

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O0

void __thiscall
Synthesizer::SynthesizerChannel::NoteOff
          (SynthesizerChannel *this,int note,int velocity,float *p,float sampletime)

{
  Voice *this_00;
  Voice *v;
  float sampletime_local;
  float *p_local;
  int velocity_local;
  int note_local;
  SynthesizerChannel *this_local;
  
  this_00 = this->keys[note];
  if ((this_00 != (Voice *)0x0) &&
     (Voice::NoteOff(this_00,note,velocity), this->keys[note] == this_00)) {
    this->keys[note] = (Voice *)0x0;
  }
  return;
}

Assistant:

void NoteOff(int note, int velocity, float* p, float sampletime)
        {
            Voice* v = keys[note];
            if (v == NULL)
                return;
            v->NoteOff(note, velocity);
            if (keys[note] == v)
                keys[note] = NULL;
        }